

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * __thiscall google::protobuf::FastUInt64ToBufferLeft(protobuf *this,uint64 u64,char *buffer)

{
  uint uVar1;
  LogMessage *other;
  long lVar2;
  LogFinisher local_8d [20];
  byte local_79;
  LogMessage local_78;
  protobuf *local_40;
  uint64 top_11_digits;
  undefined8 uStack_30;
  uint32 u;
  char *ASCII_digits;
  char *pcStack_20;
  int digits;
  char *buffer_local;
  uint64 u64_local;
  
  uStack_30 = 0;
  top_11_digits._4_4_ = (uint)this;
  pcStack_20 = (char *)u64;
  buffer_local = (char *)this;
  if ((protobuf *)((ulong)this & 0xffffffff) == this) {
    u64_local = (uint64)FastUInt32ToBufferLeft
                                  ((protobuf *)((ulong)this & 0xffffffff),(uint32)u64,buffer);
  }
  else {
    local_40 = (protobuf *)((ulong)this / 1000000000);
    pcStack_20 = FastUInt64ToBufferLeft(local_40,u64,(char *)((ulong)this % 1000000000));
    top_11_digits._4_4_ = (int)buffer_local + (int)local_40 * -1000000000;
    ASCII_digits._4_4_ = top_11_digits._4_4_ / 10000000;
    local_79 = 0;
    if (99 < ASCII_digits._4_4_) {
      internal::LogMessage::LogMessage
                (&local_78,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                 ,0x43e);
      local_79 = 1;
      other = internal::LogMessage::operator<<(&local_78,"CHECK failed: (digits) < (100): ");
      internal::LogFinisher::operator=(local_8d,other);
    }
    if ((local_79 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_78);
    }
    *pcStack_20 = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2];
    pcStack_20[1] = two_ASCII_digits[(long)(int)ASCII_digits._4_4_ * 2 + 1];
    uVar1 = top_11_digits._4_4_ + ASCII_digits._4_4_ * -10000000;
    lVar2 = (long)(int)(uVar1 / 100000) * 2;
    pcStack_20[2] = two_ASCII_digits[lVar2];
    pcStack_20[3] = two_ASCII_digits[lVar2 + 1];
    uVar1 = uVar1 % 100000;
    lVar2 = (long)(int)(uVar1 / 1000) * 2;
    pcStack_20[4] = two_ASCII_digits[lVar2];
    pcStack_20[5] = two_ASCII_digits[lVar2 + 1];
    uVar1 = uVar1 % 1000;
    lVar2 = (long)(int)(uVar1 / 10) * 2;
    pcStack_20[6] = two_ASCII_digits[lVar2];
    pcStack_20[7] = two_ASCII_digits[lVar2 + 1];
    u64_local = (uint64)(pcStack_20 + 9);
    pcStack_20[8] = (char)(uVar1 % 10) + '0';
    *(char *)u64_local = '\0';
  }
  return (char *)u64_local;
}

Assistant:

char* FastUInt64ToBufferLeft(uint64 u64, char* buffer) {
  int digits;
  const char *ASCII_digits = NULL;

  uint32 u = static_cast<uint32>(u64);
  if (u == u64) return FastUInt32ToBufferLeft(u, buffer);

  uint64 top_11_digits = u64 / 1000000000;
  buffer = FastUInt64ToBufferLeft(top_11_digits, buffer);
  u = u64 - (top_11_digits * 1000000000);

  digits = u / 10000000;  // 10,000,000
  GOOGLE_DCHECK_LT(digits, 100);
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10000000;  // 10,000,000
  digits = u / 100000;  // 100,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 100000;  // 100,000
  digits = u / 1000;  // 1,000
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 1000;  // 1,000
  digits = u / 10;
  ASCII_digits = two_ASCII_digits[digits];
  buffer[0] = ASCII_digits[0];
  buffer[1] = ASCII_digits[1];
  buffer += 2;
  u -= digits * 10;
  digits = u;
  *buffer++ = '0' + digits;
  *buffer = 0;
  return buffer;
}